

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_statement.cc
# Opt level: O2

void __thiscall
tchecker::typed_assign_statement_t::typed_assign_statement_t
          (typed_assign_statement_t *this,statement_type_t type,
          shared_ptr<const_tchecker::typed_lvalue_expression_t> *lvalue,
          shared_ptr<const_tchecker::typed_expression_t> *rvalue)

{
  int iVar1;
  invalid_argument *this_00;
  __shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<tchecker::lvalue_expression_t_const,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  *(undefined ***)&this->super_typed_statement_t = &PTR__typed_statement_t_0028cc58;
  (this->super_typed_statement_t)._type = type;
  std::__shared_ptr<tchecker::lvalue_expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_lvalue_expression_t_const,void>
            (local_40,&lvalue->
                       super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_ptr<tchecker::expression_t_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<tchecker::typed_expression_t_const,void>
            (local_50,&rvalue->
                       super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
            );
  assign_statement_t::assign_statement_t
            (&this->super_assign_statement_t,&PTR_construction_vtable_56__0028c128,
             (shared_ptr<const_tchecker::lvalue_expression_t> *)local_40,
             (shared_ptr<const_tchecker::expression_t> *)local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  *(undefined8 *)&this->super_typed_statement_t = 0x28c070;
  *(undefined8 *)&this->super_assign_statement_t = 0x28c0e0;
  iVar1 = (**(code **)(*(long *)&((lvalue->
                                  super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->super_typed_expression_t + 0x38))();
  if (iVar1 == 1) {
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"invalid lvalue expression");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

typed_assign_statement_t::typed_assign_statement_t(enum tchecker::statement_type_t type,
                                                   std::shared_ptr<tchecker::typed_lvalue_expression_t const> const & lvalue,
                                                   std::shared_ptr<tchecker::typed_expression_t const> const & rvalue)
    : tchecker::typed_statement_t(type), tchecker::assign_statement_t(lvalue, rvalue)
{
  if (lvalue->size() != 1)
    throw std::invalid_argument("invalid lvalue expression");
}